

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

Var __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,int offset,bool isFloat64,bool isInt32,
          JavascriptCallStackLayout *layout,FunctionBody *functionBody,bool boxValue)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int32 iVar5;
  undefined4 *puVar6;
  Var instance;
  ScriptContext *scriptContext;
  int32 int32Value;
  Var pvVar7;
  double value;
  
  if (offset < 0) {
    if (DAT_0145948a == '\x01') {
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
      if (bVar2) {
        Output::Print(L"Stack offset %10d",(ulong)(uint)offset);
      }
    }
    if (isFloat64) {
      value = Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
      Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      instance = Js::JavascriptNumber::ToVar(value);
      if (DAT_0145948a == '\x01') {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
        if (bVar2) {
          Output::Print(L", value: %f (ToVar: 0x%p)",value,instance);
        }
      }
      goto LAB_0050fd41;
    }
    if (!isInt32) {
      instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
      goto LAB_0050fddf;
    }
    iVar5 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
    instance = (Var)(long)iVar5;
  }
  else {
    if (this->constantCount <= (uint)offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x14a,"(static_cast<uint>(offset) < constantCount)",
                         "static_cast<uint>(offset) < constantCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    instance = this->constants[(uint)offset];
    boxValue = false;
LAB_0050fd41:
    if (!isInt32) {
LAB_0050fddf:
      if (DAT_0145948a == '\x01') {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
        if (bVar2) {
          Output::Print(L", value: 0x%p",instance);
        }
      }
      pvVar7 = instance;
      if (boxValue != false) {
        scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
        pvVar7 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false);
        if ((instance != pvVar7) && (DAT_0145948a == '\x01')) {
          uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
          LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
          if (bVar2) {
            Output::Print(L" (Boxed: 0x%p)",pvVar7);
          }
        }
      }
      goto LAB_0050feac;
    }
  }
  Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  pvVar7 = (Var)((ulong)instance & 0xffffffff | 0x1000000000000);
  if (DAT_0145948a == '\x01') {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
    if (bVar2) {
      Output::Print(L", value: %10d (ToVar: 0x%p)",(ulong)instance & 0xffffffff,pvVar7);
    }
  }
LAB_0050feac:
  if (DAT_0145948a == '\x01') {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar3,LVar4);
    if (bVar2) {
      Output::Print(L"\n");
    }
  }
  return pvVar7;
}

Assistant:

Js::Var InlineeFrameRecord::Restore(int offset, bool isFloat64, bool isInt32, Js::JavascriptCallStackLayout * layout, Js::FunctionBody* functionBody, bool boxValue) const
{
    Js::Var value;
    bool boxStackInstance = boxValue;
    double dblValue;
    if (offset >= 0)
    {
        Assert(static_cast<uint>(offset) < constantCount);
        value = this->constants[offset];
        boxStackInstance = false;
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Stack offset %10d"), offset);
        if (isFloat64)
        {
            dblValue = layout->GetDoubleAtOffset(offset);
            value = Js::JavascriptNumber::New(dblValue, functionBody->GetScriptContext());
            BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
        }
        else if (isInt32)
        {
            value = (Js::Var)layout->GetInt32AtOffset(offset);
        }
        else
        {
            value = layout->GetOffset(offset);
        }
    }

    if (isInt32)
    {
        int32 int32Value = ::Math::PointerCastToIntegralTruncate<int32>(value);
        value = Js::JavascriptNumber::ToVar(int32Value, functionBody->GetScriptContext());
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            // Do not deepCopy in this call to BoxStackInstance because this should be used for
            // bailing out, where a shallow copy that is cached is needed to ensure that multiple
            // vars pointing to the same boxed object reuse the new boxed value.
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, functionBody->GetScriptContext(), /* allowStackFunction */ true, false /* deepCopy */);

#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(functionBody, _u(" (Boxed: 0x%p)"), value);
            }
#endif
        }
    }
    BAILOUT_VERBOSE_TRACE(functionBody, _u("\n"));
    return value;
}